

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_t.c
# Opt level: O3

void test_option_t(void)

{
  wchar_t wVar1;
  char *pcVar2;
  tm *__tp;
  size_t l;
  time_t mtime;
  char date2 [32];
  char date [48];
  tm_conflict tmbuf;
  time_t local_c0;
  char local_b8 [32];
  char local_98 [48];
  tm local_68;
  
  extract_reference_file("test_option_t.cpio");
  wVar1 = systemf("%s -it < test_option_t.cpio >it.out 2>it.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_t.c"
                      ,L'\x1c',(long)wVar1,"r",0,"0",(void *)0x0);
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_t.c"
             ,L'\x1d',"1 block\n","it.err");
  extract_reference_file("test_option_t.stdout");
  pcVar2 = slurpfile((size_t *)0x0,"test_option_t.stdout");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_t.c"
             ,L' ',pcVar2,"it.out");
  free(pcVar2);
  wVar1 = systemf("%s -t < test_option_t.cpio >t.out 2>t.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_t.c"
                      ,L'%',(long)wVar1,"r",0,"0",(void *)0x0);
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_t.c"
             ,L'&',"1 block\n","t.err");
  extract_reference_file("test_option_t.stdout");
  pcVar2 = slurpfile((size_t *)0x0,"test_option_t.stdout");
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_t.c"
             ,L')',pcVar2,"t.out");
  free(pcVar2);
  wVar1 = systemf("%s -ot < test_option_t.cpio >ot.out 2>ot.err",testprog);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_t.c"
                   ,L'.',(uint)(wVar1 != L'\0'),
                   "0 != systemf(\"%s -ot < test_option_t.cpio >ot.out 2>ot.err\", testprog)",
                   (void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_t.c"
             ,L'/',"ot.out");
  wVar1 = systemf("%s -itv < test_option_t.cpio >tv.out 2>tv.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_t.c"
                      ,L'3',(long)wVar1,"r",0,"0",(void *)0x0);
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_t.c"
             ,L'4',"1 block\n","tv.err");
  extract_reference_file("test_option_tv.stdout");
  wVar1 = systemf("%s -itnv < test_option_t.cpio >itnv.out 2>itnv.err",testprog);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_t.c"
                      ,L'?',(long)wVar1,"r",0,"0",(void *)0x0);
  assertion_text_file_contents
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_t.c"
             ,L'@',"1 block\n","itnv.err");
  pcVar2 = slurpfile((size_t *)0x0,"itnv.out");
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_t.c"
                      ,L'D',pcVar2,"p","-rw-r--r--   1 1000     1000            0 ",
                      "\"-rw-r--r--   1 1000     1000            0 \"",0x2a,"42",(void *)0x0);
  local_c0 = 1;
  setlocale(6,"");
  setlocale(2,"");
  __tp = localtime_r(&local_c0,&local_68);
  strftime(local_b8,0x1f,"%b %e  %Y",__tp);
  snprintf(local_98,0x2f,"%12s file",local_b8);
  l = strlen(local_98);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_t.c"
                      ,L'Z',pcVar2 + 0x2a,"p + 42",local_98,"date",l,"strlen(date)",(void *)0x0);
  free(pcVar2);
  wVar1 = systemf("%s -in < test_option_t.cpio >in.out 2>in.err",testprog);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_t.c"
                   ,L'_',(uint)(wVar1 != L'\0'),
                   "0 != systemf(\"%s -in < test_option_t.cpio >in.out 2>in.err\", testprog)",
                   (void *)0x0);
  assertion_empty_file
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/cpio/test/test_option_t.c"
             ,L'`',"in.out");
  return;
}

Assistant:

DEFINE_TEST(test_option_t)
{
	char *p;
	int r;
	time_t mtime;
	char date[48];
	char date2[32];
	struct tm *tmptr;
#if defined(HAVE_LOCALTIME_R) || defined(HAVE_LOCALTIME_S)
	struct tm tmbuf;
#endif

	/* List reference archive, make sure the TOC is correct. */
	extract_reference_file("test_option_t.cpio");
	r = systemf("%s -it < test_option_t.cpio >it.out 2>it.err", testprog);
	assertEqualInt(r, 0);
	assertTextFileContents("1 block\n", "it.err");
	extract_reference_file("test_option_t.stdout");
	p = slurpfile(NULL, "test_option_t.stdout");
	assertTextFileContents(p, "it.out");
	free(p);

	/* We accept plain "-t" as a synonym for "-it" */
	r = systemf("%s -t < test_option_t.cpio >t.out 2>t.err", testprog);
	assertEqualInt(r, 0);
	assertTextFileContents("1 block\n", "t.err");
	extract_reference_file("test_option_t.stdout");
	p = slurpfile(NULL, "test_option_t.stdout");
	assertTextFileContents(p, "t.out");
	free(p);

	/* But "-ot" is an error. */
	assert(0 != systemf("%s -ot < test_option_t.cpio >ot.out 2>ot.err",
			    testprog));
	assertEmptyFile("ot.out");

	/* List reference archive verbosely, make sure the TOC is correct. */
	r = systemf("%s -itv < test_option_t.cpio >tv.out 2>tv.err", testprog);
	assertEqualInt(r, 0);
	assertTextFileContents("1 block\n", "tv.err");
	extract_reference_file("test_option_tv.stdout");

	/* This doesn't work because the usernames on different systems
	 * are different and cpio now looks up numeric UIDs on
	 * the local system. */
	/* assertEqualFile("tv.out", "test_option_tv.stdout"); */

	/* List reference archive with numeric IDs, verify TOC is correct. */
	r = systemf("%s -itnv < test_option_t.cpio >itnv.out 2>itnv.err",
		    testprog);
	assertEqualInt(r, 0);
	assertTextFileContents("1 block\n", "itnv.err");
	p = slurpfile(NULL, "itnv.out");
	/* Since -n uses numeric UID/GID, this part should be the
	 * same on every system. */
	assertEqualMem(p, "-rw-r--r--   1 1000     1000            0 ",42);

	/* Date varies depending on local timezone and locale. */
	mtime = 1;
#ifdef HAVE_LOCALE_H
	setlocale(LC_ALL, "");
	setlocale(LC_TIME, "");
#endif
#if defined(HAVE_LOCALTIME_S)
        tmptr = localtime_s(&tmbuf, &mtime) ? NULL : &tmbuf;
#elif defined(HAVE_LOCALTIME_R)
        tmptr = localtime_r(&mtime, &tmbuf);
#else
        tmptr = localtime(&mtime);
#endif
#if defined(_WIN32) && !defined(__CYGWIN__)
	strftime(date2, sizeof(date2)-1, "%b %d  %Y", tmptr);
	_snprintf(date, sizeof(date)-1, "%12s file", date2);
#else
	strftime(date2, sizeof(date2)-1, "%b %e  %Y", tmptr);
	snprintf(date, sizeof(date)-1, "%12s file", date2);
#endif
	assertEqualMem(p + 42, date, strlen(date));
	free(p);

	/* But "-n" without "-t" is an error. */
	assert(0 != systemf("%s -in < test_option_t.cpio >in.out 2>in.err",
			    testprog));
	assertEmptyFile("in.out");
}